

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QList<QGraphicsTransform_*> * __thiscall QGraphicsItem::transformations(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  long in_RSI;
  QList<QGraphicsTransform_*> *in_RDI;
  QList<QGraphicsTransform_*> *this_00;
  
  this_00 = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RSI + 8));
  if (pQVar1->transformData == (TransformData *)0x0) {
    memset(in_RDI,0,0x18);
    QList<QGraphicsTransform_*>::QList((QList<QGraphicsTransform_*> *)0x97e9a4);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI + 8));
    QList<QGraphicsTransform_*>::QList(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

QList<QGraphicsTransform *> QGraphicsItem::transformations() const
{
    if (!d_ptr->transformData)
        return QList<QGraphicsTransform *>();
    return d_ptr->transformData->graphicsTransforms;
}